

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintHelpOneVariable(cmDocumentation *this,ostream *os)

{
  undefined8 os_00;
  bool bVar1;
  ostream *poVar2;
  char *in_RCX;
  string_view str;
  string local_70;
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  string vname;
  ostream *os_local;
  cmDocumentation *this_local;
  
  vname.field_2._8_8_ = os;
  local_50 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)&this->CurrentArgument);
  str._M_len = local_50._8_8_;
  str._M_str = in_RCX;
  cmSystemTools::HelpFileName_abi_cxx11_((string *)local_40,local_50._0_8_,str);
  os_00 = vname.field_2._8_8_;
  cmStrCat<char_const(&)[10],std::__cxx11::string&>
            (&local_70,(char (*) [10])"variable/",(string *)local_40);
  bVar1 = PrintFiles(this,(ostream *)os_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)vname.field_2._8_8_,"Argument \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->CurrentArgument);
    std::operator<<(poVar2,
                    "\" to --help-variable is not a defined variable.  Use --help-variable-list to see all defined variables.\n"
                   );
  }
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOneVariable(std::ostream& os)
{
  std::string vname = cmSystemTools::HelpFileName(this->CurrentArgument);
  if (this->PrintFiles(os, cmStrCat("variable/", vname))) {
    return true;
  }
  // Argument was not a variable.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-variable is not a defined variable.  "
        "Use --help-variable-list to see all defined variables.\n";
  return false;
}